

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionElimination.cc
# Opt level: O2

bool flow::transform::rewriteCondBrToSameBranches(IRHandler *handler)

{
  BasicBlock *this;
  TerminateInstr *pTVar1;
  long lVar2;
  byte bVar3;
  undefined8 in_RCX;
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *plVar4;
  pointer *__ptr;
  _List_node_base *p_Var5;
  BasicBlock *nextBB;
  _Head_base<0UL,_flow::Instr_*,_false> local_48;
  _Head_base<0UL,_flow::Instr_*,_false> local_40;
  _func_int **local_38;
  long local_30;
  
  plVar4 = &handler->blocks_;
  p_Var5 = (_List_node_base *)plVar4;
  do {
    do {
      bVar3 = (byte)in_RCX;
      p_Var5 = (((_List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                  *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var5 == (_List_node_base *)plVar4) goto LAB_0014a40f;
      this = (BasicBlock *)p_Var5[1]._M_next;
      pTVar1 = BasicBlock::getTerminator(this);
    } while (pTVar1 == (TerminateInstr *)0x0);
    in_RCX = 0;
    lVar2 = __dynamic_cast(pTVar1,&TerminateInstr::typeinfo,&CondBrInstr::typeinfo);
  } while (lVar2 == 0);
  local_30 = *(long *)(*(long *)(lVar2 + 0x50) + 8);
  if (local_30 == *(long *)(*(long *)(lVar2 + 0x50) + 0x10)) {
    BasicBlock::remove((BasicBlock *)&stack0xffffffffffffffc8,(char *)this);
    if (local_38 != (_func_int **)0x0) {
      (**(code **)(*local_38 + 8))();
    }
    local_38 = (_func_int **)0x0;
    std::make_unique<flow::BrInstr,flow::BasicBlock*&>((BasicBlock **)&local_40);
    local_48._M_head_impl = local_40._M_head_impl;
    local_40._M_head_impl = (Instr *)0x0;
    BasicBlock::push_back
              (this,(unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)&local_48);
    if (local_48._M_head_impl != (Instr *)0x0) {
      (*((local_48._M_head_impl)->super_Value)._vptr_Value[1])();
    }
    local_48._M_head_impl = (Instr *)0x0;
    if (local_40._M_head_impl != (Instr *)0x0) {
      (*((local_40._M_head_impl)->super_Value)._vptr_Value[1])();
    }
    bVar3 = 1;
  }
  else {
    bVar3 = 0;
  }
LAB_0014a40f:
  return (bool)(p_Var5 != (_List_node_base *)plVar4 & bVar3);
}

Assistant:

bool rewriteCondBrToSameBranches(IRHandler* handler) {
  for (BasicBlock* bb : handler->basicBlocks()) {
    // attempt to eliminate useless condbr
    if (CondBrInstr* condbr = dynamic_cast<CondBrInstr*>(bb->getTerminator())) {
      if (condbr->trueBlock() != condbr->falseBlock())
        return false;

      BasicBlock* nextBB = condbr->trueBlock();

      // remove old terminator
      bb->remove(condbr);

      // create new terminator
      bb->push_back(std::make_unique<BrInstr>(nextBB));

      //FLOW_TRACE("flow: rewrote condbr with true-block == false-block");
      return true;
    }
  }

  return false;
}